

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void testing::internal::MatcherBase<std::pair<phmap::priv::NonStandardLayout,int>const&>::
     ValuePolicy<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,int>>,false>
     ::Init<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,int>>>
               (MatcherBase<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *m,
               EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_> *arg)

{
  SharedPayload<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  *this;
  
  this = (SharedPayload<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
          *)operator_new(0x38);
  SharedPayload<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_>_>::
  SharedPayload(this,arg);
  (m->buffer_).shared = (SharedPayloadBase *)this;
  return;
}

Assistant:

static void Init(MatcherBase& m, Arg&& arg) {
      m.buffer_.shared = new Shared(std::forward<Arg>(arg));
    }